

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Schema * sqlite3SchemaGet(sqlite3 *db,Btree *pBt)

{
  Schema *pSVar1;
  
  if (pBt == (Btree *)0x0) {
    pSVar1 = (Schema *)sqlite3Malloc(0x78);
    if (pSVar1 != (Schema *)0x0) {
      (pSVar1->fkeyHash).ht = (_ht *)0x0;
      pSVar1->pSeqTab = (Table *)0x0;
      (pSVar1->fkeyHash).htsize = 0;
      (pSVar1->fkeyHash).count = 0;
      (pSVar1->fkeyHash).first = (HashElem *)0x0;
      (pSVar1->trigHash).first = (HashElem *)0x0;
      (pSVar1->trigHash).ht = (_ht *)0x0;
      (pSVar1->idxHash).ht = (_ht *)0x0;
      (pSVar1->trigHash).htsize = 0;
      (pSVar1->trigHash).count = 0;
      (pSVar1->idxHash).htsize = 0;
      (pSVar1->idxHash).count = 0;
      (pSVar1->idxHash).first = (HashElem *)0x0;
      (pSVar1->tblHash).first = (HashElem *)0x0;
      (pSVar1->tblHash).ht = (_ht *)0x0;
      pSVar1->schema_cookie = 0;
      pSVar1->iGeneration = 0;
      (pSVar1->tblHash).htsize = 0;
      (pSVar1->tblHash).count = 0;
      pSVar1->file_format = '\0';
      pSVar1->enc = '\0';
      pSVar1->schemaFlags = 0;
      pSVar1->cache_size = 0;
      goto LAB_001bb628;
    }
  }
  else {
    pSVar1 = (Schema *)sqlite3BtreeSchema(pBt,0x78,sqlite3SchemaClear);
    if (pSVar1 != (Schema *)0x0) {
LAB_001bb628:
      if (pSVar1->file_format != '\0') {
        return pSVar1;
      }
      (pSVar1->fkeyHash).first = (HashElem *)0x0;
      (pSVar1->fkeyHash).ht = (_ht *)0x0;
      (pSVar1->trigHash).ht = (_ht *)0x0;
      (pSVar1->fkeyHash).htsize = 0;
      (pSVar1->fkeyHash).count = 0;
      (pSVar1->trigHash).htsize = 0;
      (pSVar1->trigHash).count = 0;
      (pSVar1->trigHash).first = (HashElem *)0x0;
      (pSVar1->idxHash).first = (HashElem *)0x0;
      (pSVar1->idxHash).ht = (_ht *)0x0;
      (pSVar1->tblHash).ht = (_ht *)0x0;
      (pSVar1->idxHash).htsize = 0;
      (pSVar1->idxHash).count = 0;
      (pSVar1->tblHash).htsize = 0;
      (pSVar1->tblHash).count = 0;
      (pSVar1->tblHash).first = (HashElem *)0x0;
      pSVar1->enc = '\x01';
      return pSVar1;
    }
  }
  sqlite3OomFault(db);
  return (Schema *)0x0;
}

Assistant:

SQLITE_PRIVATE Schema *sqlite3SchemaGet(sqlite3 *db, Btree *pBt){
  Schema * p;
  if( pBt ){
    p = (Schema *)sqlite3BtreeSchema(pBt, sizeof(Schema), sqlite3SchemaClear);
  }else{
    p = (Schema *)sqlite3DbMallocZero(0, sizeof(Schema));
  }
  if( !p ){
    sqlite3OomFault(db);
  }else if ( 0==p->file_format ){
    sqlite3HashInit(&p->tblHash);
    sqlite3HashInit(&p->idxHash);
    sqlite3HashInit(&p->trigHash);
    sqlite3HashInit(&p->fkeyHash);
    p->enc = SQLITE_UTF8;
  }
  return p;
}